

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pkcs12_test.cc
# Opt level: O2

void __thiscall PKCS12Test_TestEmptyPassword_Test::TestBody(PKCS12Test_TestEmptyPassword_Test *this)

{
  Span<const_unsigned_char> der;
  Span<const_unsigned_char> der_00;
  Span<const_unsigned_char> der_01;
  Span<const_unsigned_char> der_02;
  int iVar1;
  char *in_R9;
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  EVP_PKEY *key;
  AssertHelper local_88;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_80;
  UniquePtr<struct_stack_st_X509> certs;
  AssertionResult gtest_ar__1;
  string local_60;
  string data;
  CBS pkcs12;
  
  GetTestData_abi_cxx11_(&data,"crypto/pkcs8/test/empty_password.p12");
  der.size_ = data._M_string_length;
  der.data_ = (uchar *)data._M_dataplus._M_p;
  TestImpl("EmptyPassword (empty password)",der,"",(char *)0x0);
  der_00.size_ = data._M_string_length;
  der_00.data_ = (uchar *)data._M_dataplus._M_p;
  TestImpl("EmptyPassword (null password)",der_00,(char *)0x0,(char *)0x0);
  GetTestData_abi_cxx11_(&local_60,"crypto/pkcs8/test/empty_password_ber.p12");
  std::__cxx11::string::operator=((string *)&data,(string *)&local_60);
  std::__cxx11::string::~string((string *)&local_60);
  der_01.size_ = data._M_string_length;
  der_01.data_ = (uchar *)data._M_dataplus._M_p;
  TestImpl("EmptyPassword (BER, empty password)",der_01,"",(char *)0x0);
  der_02.size_ = data._M_string_length;
  der_02.data_ = (uchar *)data._M_dataplus._M_p;
  TestImpl("EmptyPassword (BER, null password)",der_02,(char *)0x0,(char *)0x0);
  GetTestData_abi_cxx11_(&local_60,"crypto/pkcs8/test/empty_password_ber_nested.p12");
  std::__cxx11::string::operator=((string *)&data,(string *)&local_60);
  std::__cxx11::string::~string((string *)&local_60);
  certs._M_t.super___uniq_ptr_impl<stack_st_X509,_bssl::internal::Deleter>._M_t.
  super__Tuple_impl<0UL,_stack_st_X509_*,_bssl::internal::Deleter>.
  super__Head_base<0UL,_stack_st_X509_*,_false>._M_head_impl =
       (__uniq_ptr_data<stack_st_X509,_bssl::internal::Deleter,_true,_true>)OPENSSL_sk_new_null();
  this_00 = (unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&pkcs12.len;
  pkcs12.len = 0;
  pkcs12.data = (uint8_t *)
                CONCAT71(pkcs12.data._1_7_,
                         (tuple<stack_st_X509_*,_bssl::internal::Deleter>)
                         certs._M_t.super___uniq_ptr_impl<stack_st_X509,_bssl::internal::Deleter>.
                         _M_t.super__Tuple_impl<0UL,_stack_st_X509_*,_bssl::internal::Deleter>.
                         super__Head_base<0UL,_stack_st_X509_*,_false>._M_head_impl !=
                         (_Head_base<0UL,_stack_st_X509_*,_false>)0x0);
  if ((tuple<stack_st_X509_*,_bssl::internal::Deleter>)
      certs._M_t.super___uniq_ptr_impl<stack_st_X509,_bssl::internal::Deleter>._M_t.
      super__Tuple_impl<0UL,_stack_st_X509_*,_bssl::internal::Deleter>.
      super__Head_base<0UL,_stack_st_X509_*,_false>._M_head_impl ==
      (_Head_base<0UL,_stack_st_X509_*,_false>)0x0) {
    testing::Message::Message((Message *)&gtest_ar__1);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_60,(internal *)&pkcs12,(AssertionResult *)0x527c94,"false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&key,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/pkcs8/pkcs12_test.cc"
               ,0x9c,local_60._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=((AssertHelper *)&key,(Message *)&gtest_ar__1);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&key);
    std::__cxx11::string::~string((string *)&local_60);
    local_80._M_head_impl =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
         CONCAT71(gtest_ar__1._1_7_,gtest_ar__1.success_);
  }
  else {
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(this_00);
    key = (EVP_PKEY *)0x0;
    pkcs12.data = (uint8_t *)data._M_dataplus._M_p;
    pkcs12.len = data._M_string_length;
    iVar1 = PKCS12_get_key_and_certs
                      (&key,(stack_st_X509 *)
                            certs._M_t.super___uniq_ptr_impl<stack_st_X509,_bssl::internal::Deleter>
                            ._M_t.super__Tuple_impl<0UL,_stack_st_X509_*,_bssl::internal::Deleter>.
                            super__Head_base<0UL,_stack_st_X509_*,_false>._M_head_impl,&pkcs12,"");
    this_00 = &gtest_ar__1.message_;
    gtest_ar__1.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl =
         (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )0x0;
    gtest_ar__1.success_ = iVar1 == 0;
    if (gtest_ar__1.success_) goto LAB_002fb1a7;
    testing::Message::Message((Message *)&local_80);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_60,(internal *)&gtest_ar__1,
               (AssertionResult *)"PKCS12_get_key_and_certs(&key, certs.get(), &pkcs12, \"\")",
               "true","false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_88,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/pkcs8/pkcs12_test.cc"
               ,0x9f,local_60._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_88,(Message *)&local_80);
    testing::internal::AssertHelper::~AssertHelper(&local_88);
    std::__cxx11::string::~string((string *)&local_60);
  }
  if (local_80._M_head_impl !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    (**(code **)(*(long *)local_80._M_head_impl + 8))();
  }
LAB_002fb1a7:
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(this_00);
  std::unique_ptr<stack_st_X509,_bssl::internal::Deleter>::~unique_ptr(&certs);
  std::__cxx11::string::~string((string *)&data);
  return;
}

Assistant:

TEST(PKCS12Test, TestEmptyPassword) {
  // Generated with
  //   openssl pkcs12 -export -inkey ecdsa_p256_key.pem -in ecdsa_p256_cert.pem -password pass:  
  std::string data = GetTestData("crypto/pkcs8/test/empty_password.p12");
  TestImpl("EmptyPassword (empty password)", bssl::StringAsBytes(data), "",
           nullptr);
  TestImpl("EmptyPassword (null password)", bssl::StringAsBytes(data), nullptr,
           nullptr);

  // The above input, modified to have a constructed string.
  data = GetTestData("crypto/pkcs8/test/empty_password_ber.p12");
  TestImpl("EmptyPassword (BER, empty password)", bssl::StringAsBytes(data), "",
           nullptr);
  TestImpl("EmptyPassword (BER, null password)", bssl::StringAsBytes(data),
           nullptr, nullptr);

  // The constructed string with too much recursion.
  data = GetTestData("crypto/pkcs8/test/empty_password_ber_nested.p12");
  bssl::UniquePtr<STACK_OF(X509)> certs(sk_X509_new_null());
  ASSERT_TRUE(certs);
  EVP_PKEY *key = nullptr;
  CBS pkcs12 = bssl::StringAsBytes(data);
  EXPECT_FALSE(PKCS12_get_key_and_certs(&key, certs.get(), &pkcs12, ""));
}